

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::handlePackOffset
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *location,
          TString *component)

{
  size_type __n;
  int iVar1;
  byte bVar2;
  char *pcVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_50;
  
  __n = location->_M_string_length;
  if ((__n != 0) && (pcVar3 = (location->_M_dataplus)._M_p, *pcVar3 == 'c')) {
    if (__n != 1) {
      if (9 < (int)pcVar3[1] - 0x30U) {
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar3 = "expected number after \'c\'";
        goto LAB_0039841f;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      substr(&local_50,location,1,__n);
      iVar1 = atoi(local_50._M_dataplus._M_p);
      qualifier->layoutOffset = iVar1 << 4;
      if (component != (TString *)0x0) {
        bVar2 = *(component->_M_dataplus)._M_p + 0x89;
        if ((bVar2 < 4) && (component->_M_string_length < 2)) {
          qualifier->layoutOffset = iVar1 << 4 | *(uint *)(&DAT_0072fda0 + (ulong)bVar2 * 4);
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"expected {x, y, z, w} for component","packoffset","");
        }
      }
    }
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar3 = "expected \'c\'";
LAB_0039841f:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar3,"packoffset","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::handlePackOffset(const TSourceLoc& loc, TQualifier& qualifier, const glslang::TString& location,
                                        const glslang::TString* component)
{
    if (location.size() == 0 || location[0] != 'c') {
        error(loc, "expected 'c'", "packoffset", "");
        return;
    }
    if (location.size() == 1)
        return;
    if (! isdigit(location[1])) {
        error(loc, "expected number after 'c'", "packoffset", "");
        return;
    }

    qualifier.layoutOffset = 16 * atoi(location.substr(1, location.size()).c_str());
    if (component != nullptr) {
        int componentOffset = 0;
        switch ((*component)[0]) {
        case 'x': componentOffset =  0; break;
        case 'y': componentOffset =  4; break;
        case 'z': componentOffset =  8; break;
        case 'w': componentOffset = 12; break;
        default:
            componentOffset = -1;
            break;
        }
        if (componentOffset < 0 || component->size() > 1) {
            error(loc, "expected {x, y, z, w} for component", "packoffset", "");
            return;
        }
        qualifier.layoutOffset += componentOffset;
    }
}